

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darknet2ncnn.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  FILE *pFVar1;
  bool bVar2;
  uint uVar3;
  size_type sVar4;
  reference ppSVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  reference pbVar8;
  reference pvVar9;
  undefined8 *in_RSI;
  int in_EDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> p;
  iterator __end2_2;
  iterator __begin2_2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> b_1;
  deque<Section_*,_std::allocator<Section_*>_> *in_stack_00000108;
  iterator __end2_1;
  iterator __begin2_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> b;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  Section *s;
  iterator __end1;
  iterator __begin1;
  deque<Section_*,_std::allocator<Section_*>_> *__range1;
  FILE *bp;
  FILE *pp;
  deque<Section_*,_std::allocator<Section_*>_> dnet;
  int merge_output;
  char *ncnn_bin;
  char *ncnn_param;
  char *darknetweights;
  char *darknetcfg;
  int in_stack_000010fc;
  deque<Section_*,_std::allocator<Section_*>_> *in_stack_00001100;
  _Self *in_stack_fffffffffffffda8;
  _Self *in_stack_fffffffffffffdb0;
  FILE *in_stack_fffffffffffffe00;
  deque<Section_*,_std::allocator<Section_*>_> *in_stack_fffffffffffffe18;
  undefined4 in_stack_fffffffffffffe20;
  undefined4 in_stack_fffffffffffffe24;
  int local_1b4;
  char *local_1b0;
  char *local_1a8;
  string local_1a0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_180;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_178;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_170;
  string local_168 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_148;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_140;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_138;
  string local_130 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_110;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_108;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_100;
  Section *local_f8;
  _Deque_iterator<Section_*,_Section_*&,_Section_**> local_d0;
  undefined1 *local_b0;
  FILE *local_a8;
  FILE *local_a0;
  undefined1 local_88 [84];
  int local_34;
  char *local_30;
  char *local_28;
  undefined8 local_20;
  undefined8 local_18;
  int local_4;
  
  local_4 = 0;
  if (((in_EDI == 3) || (in_EDI == 5)) || (in_EDI == 6)) {
    local_18 = in_RSI[1];
    local_20 = in_RSI[2];
    if (in_EDI < 5) {
      local_1a8 = "ncnn.param";
    }
    else {
      local_1a8 = (char *)in_RSI[3];
    }
    local_28 = local_1a8;
    if (in_EDI < 5) {
      local_1b0 = "ncnn.bin";
    }
    else {
      local_1b0 = (char *)in_RSI[4];
    }
    local_30 = local_1b0;
    if (in_EDI < 6) {
      local_1b4 = 1;
    }
    else {
      local_1b4 = atoi((char *)in_RSI[5]);
    }
    local_34 = local_1b4;
    std::deque<Section_*,_std::allocator<Section_*>_>::deque
              ((deque<Section_*,_std::allocator<Section_*>_> *)0x11b099);
    printf("Loading cfg...\n");
    load_cfg((char *)__end2_1._M_current,in_stack_00000108);
    parse_cfg(in_stack_00001100,in_stack_000010fc);
    printf("Loading weights...\n");
    load_weights((char *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                 in_stack_fffffffffffffe18);
    local_a0 = fopen(local_28,"wb");
    if (local_a0 == (FILE *)0x0) {
      file_error((char *)0x11b143);
    }
    local_a8 = fopen(local_30,"wb");
    if (local_a8 == (FILE *)0x0) {
      file_error((char *)0x11b1b1);
    }
    printf("Converting model...\n");
    fprintf(local_a0,"7767517\n");
    pFVar1 = local_a0;
    sVar4 = std::deque<Section_*,_std::allocator<Section_*>_>::size
                      ((deque<Section_*,_std::allocator<Section_*>_> *)0x11b1f4);
    uVar3 = count_output_blob((deque<Section_*,_std::allocator<Section_*>_> *)
                              in_stack_fffffffffffffe00);
    fprintf(pFVar1,"%d %d\n",sVar4 & 0xffffffff,(ulong)uVar3);
    local_b0 = local_88;
    std::deque<Section_*,_std::allocator<Section_*>_>::begin
              ((deque<Section_*,_std::allocator<Section_*>_> *)in_stack_fffffffffffffda8);
    std::deque<Section_*,_std::allocator<Section_*>_>::end
              ((deque<Section_*,_std::allocator<Section_*>_> *)in_stack_fffffffffffffda8);
    while (bVar2 = std::operator!=(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8), bVar2) {
      ppSVar5 = std::_Deque_iterator<Section_*,_Section_*&,_Section_**>::operator*(&local_d0);
      pFVar1 = local_a0;
      local_f8 = *ppSVar5;
      uVar6 = std::__cxx11::string::c_str();
      uVar7 = std::__cxx11::string::c_str();
      sVar4 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(&local_f8->input_blobs);
      uVar3 = (uint)sVar4;
      sVar4 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(&local_f8->output_blobs);
      fprintf(pFVar1,"%-22s %-20s %d %d",uVar6,uVar7,(ulong)uVar3,sVar4 & 0xffffffff);
      local_100 = &local_f8->input_blobs;
      local_108._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_fffffffffffffda8);
      local_110 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)in_stack_fffffffffffffda8);
      while (bVar2 = __gnu_cxx::operator!=
                               ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)in_stack_fffffffffffffdb0,
                                (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)in_stack_fffffffffffffda8), bVar2) {
        pbVar8 = __gnu_cxx::
                 __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&local_108);
        std::__cxx11::string::string(local_130,(string *)pbVar8);
        in_stack_fffffffffffffe00 = local_a0;
        uVar6 = std::__cxx11::string::c_str();
        fprintf(in_stack_fffffffffffffe00," %s",uVar6);
        std::__cxx11::string::~string(local_130);
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&local_108);
      }
      local_138 = &local_f8->output_blobs;
      local_140._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_fffffffffffffda8);
      local_148 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)in_stack_fffffffffffffda8);
      while (bVar2 = __gnu_cxx::operator!=
                               ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)in_stack_fffffffffffffdb0,
                                (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)in_stack_fffffffffffffda8), bVar2) {
        pbVar8 = __gnu_cxx::
                 __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&local_140);
        std::__cxx11::string::string(local_168,(string *)pbVar8);
        pFVar1 = local_a0;
        uVar6 = std::__cxx11::string::c_str();
        fprintf(pFVar1," %s",uVar6);
        std::__cxx11::string::~string(local_168);
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&local_140);
      }
      local_170 = &local_f8->param;
      local_178._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_fffffffffffffda8);
      local_180 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)in_stack_fffffffffffffda8);
      while (bVar2 = __gnu_cxx::operator!=
                               ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)in_stack_fffffffffffffdb0,
                                (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)in_stack_fffffffffffffda8), bVar2) {
        pbVar8 = __gnu_cxx::
                 __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&local_178);
        std::__cxx11::string::string(local_1a0,(string *)pbVar8);
        pFVar1 = local_a0;
        uVar6 = std::__cxx11::string::c_str();
        fprintf(pFVar1," %s",uVar6);
        std::__cxx11::string::~string(local_1a0);
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&local_178);
      }
      fprintf(local_a0,"\n");
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffffdb0,(char *)in_stack_fffffffffffffda8);
      if (bVar2) {
        fseek(local_a8,4,1);
        sVar4 = std::vector<float,_std::allocator<float>_>::size(&local_f8->weights);
        if (sVar4 != 0) {
          pvVar9 = std::vector<float,_std::allocator<float>_>::operator[](&local_f8->weights,0);
          sVar4 = std::vector<float,_std::allocator<float>_>::size(&local_f8->weights);
          fwrite(pvVar9,4,sVar4,local_a8);
        }
        sVar4 = std::vector<float,_std::allocator<float>_>::size(&local_f8->scales);
        if (sVar4 != 0) {
          pvVar9 = std::vector<float,_std::allocator<float>_>::operator[](&local_f8->scales,0);
          sVar4 = std::vector<float,_std::allocator<float>_>::size(&local_f8->scales);
          fwrite(pvVar9,4,sVar4,local_a8);
        }
        sVar4 = std::vector<float,_std::allocator<float>_>::size(&local_f8->rolling_mean);
        if (sVar4 != 0) {
          pvVar9 = std::vector<float,_std::allocator<float>_>::operator[](&local_f8->rolling_mean,0)
          ;
          sVar4 = std::vector<float,_std::allocator<float>_>::size(&local_f8->rolling_mean);
          fwrite(pvVar9,4,sVar4,local_a8);
        }
        sVar4 = std::vector<float,_std::allocator<float>_>::size(&local_f8->rolling_variance);
        if (sVar4 != 0) {
          pvVar9 = std::vector<float,_std::allocator<float>_>::operator[]
                             (&local_f8->rolling_variance,0);
          sVar4 = std::vector<float,_std::allocator<float>_>::size(&local_f8->rolling_variance);
          fwrite(pvVar9,4,sVar4,local_a8);
        }
        sVar4 = std::vector<float,_std::allocator<float>_>::size(&local_f8->bias);
        if (sVar4 != 0) {
          pvVar9 = std::vector<float,_std::allocator<float>_>::operator[](&local_f8->bias,0);
          sVar4 = std::vector<float,_std::allocator<float>_>::size(&local_f8->bias);
          fwrite(pvVar9,4,sVar4,local_a8);
        }
      }
      std::_Deque_iterator<Section_*,_Section_*&,_Section_**>::operator++(in_stack_fffffffffffffdb0)
      ;
    }
    fclose(local_a0);
    sVar4 = std::deque<Section_*,_std::allocator<Section_*>_>::size
                      ((deque<Section_*,_std::allocator<Section_*>_> *)0x11b81c);
    uVar3 = count_output_blob((deque<Section_*,_std::allocator<Section_*>_> *)
                              in_stack_fffffffffffffe00);
    printf("%d layers, %d blobs generated.\n",sVar4 & 0xffffffff,(ulong)uVar3);
    printf("NOTE: The input of darknet uses: mean_vals=0 and norm_vals=1/255.f.\n");
    if (local_34 == 0) {
      printf("NOTE: There are %d unmerged yolo output layer. Make sure all outputs are processed with nms.\n"
             ,(ulong)(uint)yolo_layer_count);
    }
    if ((letter_box_enabled & 1U) != 0) {
      printf("NOTE: Make sure your pre-processing and post-processing support letter_box.\n");
    }
    printf("NOTE: Remember to use ncnnoptimize for better performance.\n");
    local_4 = 0;
    std::deque<Section_*,_std::allocator<Section_*>_>::~deque
              ((deque<Section_*,_std::allocator<Section_*>_> *)in_stack_fffffffffffffe00);
  }
  else {
    fprintf(_stderr,
            "Usage: %s [darknetcfg] [darknetweights] [ncnnparam] [ncnnbin] [merge_output]\n\t[darknetcfg]     .cfg file of input darknet model.\n\t[darknetweights] .weights file of input darknet model.\n\t[cnnparam]       .param file of output ncnn model.\n\t[ncnnbin]        .bin file of output ncnn model.\n\t[merge_output]   merge all output yolo layers into one, enabled by default.\n"
            ,*in_RSI);
    local_4 = -1;
  }
  return local_4;
}

Assistant:

int main(int argc, char** argv)
{
    if (!(argc == 3 || argc == 5 || argc == 6))
    {
        fprintf(stderr, "Usage: %s [darknetcfg] [darknetweights] [ncnnparam] [ncnnbin] [merge_output]\n"
                "\t[darknetcfg]     .cfg file of input darknet model.\n"
                "\t[darknetweights] .weights file of input darknet model.\n"
                "\t[cnnparam]       .param file of output ncnn model.\n"
                "\t[ncnnbin]        .bin file of output ncnn model.\n"
                "\t[merge_output]   merge all output yolo layers into one, enabled by default.\n",
                argv[0]);
        return -1;
    }

    const char* darknetcfg = argv[1];
    const char* darknetweights = argv[2];
    const char* ncnn_param = argc >= 5 ? argv[3] : "ncnn.param";
    const char* ncnn_bin = argc >= 5 ? argv[4] : "ncnn.bin";
    int merge_output = argc >= 6 ? atoi(argv[5]) : 1;

    std::deque<Section*> dnet;

    printf("Loading cfg...\n");
    load_cfg(darknetcfg, dnet);
    parse_cfg(dnet, merge_output);

    printf("Loading weights...\n");
    load_weights(darknetweights, dnet);

    FILE* pp = fopen(ncnn_param, "wb");
    if (pp == NULL)
        file_error(ncnn_param);

    FILE* bp = fopen(ncnn_bin, "wb");
    if (bp == NULL)
        file_error(ncnn_bin);

    printf("Converting model...\n");

    fprintf(pp, "7767517\n");
    fprintf(pp, "%d %d\n", (int)dnet.size(), count_output_blob(dnet));

    for (auto s : dnet)
    {
        fprintf(pp, "%-22s %-20s %d %d", s->layer_type.c_str(), s->layer_name.c_str(), (int)s->input_blobs.size(), (int)s->output_blobs.size());
        for (auto b : s->input_blobs)
            fprintf(pp, " %s", b.c_str());
        for (auto b : s->output_blobs)
            fprintf(pp, " %s", b.c_str());
        for (auto p : s->param)
            fprintf(pp, " %s", p.c_str());
        fprintf(pp, "\n");

        if (s->name == "convolutional")
        {
            fseek(bp, 4, SEEK_CUR);
            if (s->weights.size() > 0)
                fwrite(&s->weights[0], sizeof(float), s->weights.size(), bp);
            if (s->scales.size() > 0)
                fwrite(&s->scales[0], sizeof(float), s->scales.size(), bp);
            if (s->rolling_mean.size() > 0)
                fwrite(&s->rolling_mean[0], sizeof(float), s->rolling_mean.size(), bp);
            if (s->rolling_variance.size() > 0)
                fwrite(&s->rolling_variance[0], sizeof(float), s->rolling_variance.size(), bp);
            if (s->bias.size() > 0)
                fwrite(&s->bias[0], sizeof(float), s->bias.size(), bp);
        }
    }
    fclose(pp);

    printf("%d layers, %d blobs generated.\n", (int)dnet.size(), count_output_blob(dnet));
    printf("NOTE: The input of darknet uses: mean_vals=0 and norm_vals=1/255.f.\n");
    if (!merge_output)
        printf("NOTE: There are %d unmerged yolo output layer. Make sure all outputs are processed with nms.\n", yolo_layer_count);
    if (letter_box_enabled)
        printf("NOTE: Make sure your pre-processing and post-processing support letter_box.\n");
    printf("NOTE: Remember to use ncnnoptimize for better performance.\n");

    return 0;
}